

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

int __thiscall QAccessibleTableCell::columnIndex(QAccessibleTableCell *this)

{
  int iVar1;
  ulong uVar2;
  long *in_RDI;
  undefined4 local_4;
  
  uVar2 = (**(code **)(*in_RDI + 0x10))();
  if ((uVar2 & 1) == 0) {
    local_4 = -1;
  }
  else {
    iVar1 = (**(code **)(*in_RDI + 0x78))();
    if (iVar1 == 0x22) {
      local_4 = 0;
    }
    else {
      local_4 = QPersistentModelIndex::column();
    }
  }
  return local_4;
}

Assistant:

int QAccessibleTableCell::columnIndex() const
{
    if (!isValid())
        return -1;
#if QT_CONFIG(listview)
    if (role() == QAccessible::ListItem) {
        return 0;
    }
#endif
    return m_index.column();
}